

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprPhraseFree(Fts5ExprPhrase *pPhrase)

{
  long in_RDI;
  Fts5ExprTerm *pTerm;
  Fts5ExprTerm *pNext;
  Fts5ExprTerm *pSyn;
  int i;
  Fts5IndexIter *pIndexIter;
  Fts5IndexIter *local_18;
  int local_c;
  
  if (in_RDI != 0) {
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x18); local_c = local_c + 1) {
      pIndexIter = (Fts5IndexIter *)&DAT_aaaaaaaaaaaaaaaa;
      sqlite3_free((void *)0x26b48b);
      sqlite3Fts5IterClose(pIndexIter);
      local_18 = *(Fts5IndexIter **)(in_RDI + (long)local_c * 0x28 + 0x40);
      while (local_18 != (Fts5IndexIter *)0x0) {
        local_18 = (Fts5IndexIter *)local_18[1].pData;
        sqlite3Fts5IterClose(local_18);
        sqlite3Fts5BufferFree((Fts5Buffer *)0x26b4d7);
        sqlite3_free((void *)0x26b4e1);
      }
    }
    if (0 < *(int *)(in_RDI + 0x14)) {
      sqlite3Fts5BufferFree((Fts5Buffer *)0x26b518);
    }
    sqlite3_free((void *)0x26b522);
  }
  return;
}

Assistant:

static void fts5ExprPhraseFree(Fts5ExprPhrase *pPhrase){
  if( pPhrase ){
    int i;
    for(i=0; i<pPhrase->nTerm; i++){
      Fts5ExprTerm *pSyn;
      Fts5ExprTerm *pNext;
      Fts5ExprTerm *pTerm = &pPhrase->aTerm[i];
      sqlite3_free(pTerm->pTerm);
      sqlite3Fts5IterClose(pTerm->pIter);
      for(pSyn=pTerm->pSynonym; pSyn; pSyn=pNext){
        pNext = pSyn->pSynonym;
        sqlite3Fts5IterClose(pSyn->pIter);
        fts5BufferFree((Fts5Buffer*)&pSyn[1]);
        sqlite3_free(pSyn);
      }
    }
    if( pPhrase->poslist.nSpace>0 ) fts5BufferFree(&pPhrase->poslist);
    sqlite3_free(pPhrase);
  }
}